

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O2

int zip_create(char *zipname,char **filenames,size_t len)

{
  char cVar1;
  char *__file;
  char *pcVar2;
  bool bVar3;
  mz_bool mVar4;
  int iVar5;
  char *pcVar6;
  int iVar7;
  char *pArchive_name;
  size_t sVar8;
  uint ext_attributes;
  mz_zip_archive zip_archive;
  stat file_stat;
  
  iVar7 = -1;
  if ((zipname != (char *)0x0) && (*zipname != '\0')) {
    zip_archive.m_pIO_opaque = (void *)0x0;
    zip_archive.m_pState = (mz_zip_internal_state *)0x0;
    zip_archive.m_pWrite = (mz_file_write_func)0x0;
    zip_archive.m_pNeeds_keepalive = (mz_file_needs_keepalive)0x0;
    zip_archive.m_pAlloc_opaque = (void *)0x0;
    zip_archive.m_pRead = (mz_file_read_func)0x0;
    zip_archive.m_pFree = (mz_free_func)0x0;
    zip_archive.m_pRealloc = (mz_realloc_func)0x0;
    zip_archive.m_file_offset_alignment = 0;
    zip_archive.m_pAlloc = (mz_alloc_func)0x0;
    zip_archive.m_total_files = 0;
    zip_archive.m_zip_mode = MZ_ZIP_MODE_INVALID;
    zip_archive.m_zip_type = MZ_ZIP_TYPE_INVALID;
    zip_archive.m_last_error = MZ_ZIP_NO_ERROR;
    zip_archive.m_archive_size = 0;
    zip_archive.m_central_directory_file_ofs = 0;
    ext_attributes = 0;
    mVar4 = mz_zip_writer_init_file(&zip_archive,zipname,0);
    if (mVar4 != 0) {
      memset(&file_stat,0,0x90);
      iVar7 = -1;
      sVar8 = 0;
      do {
        if (sVar8 == len) {
          iVar7 = 0;
          break;
        }
        __file = filenames[sVar8];
        if (__file == (char *)0x0) break;
        iVar5 = stat(__file,(stat *)&file_stat);
        if (iVar5 != 0) {
          return -1;
        }
        bVar3 = true;
        pcVar6 = __file;
        pcVar2 = __file;
        while( true ) {
          do {
            do {
              pArchive_name = pcVar6;
              pcVar6 = pcVar2 + 1;
              cVar1 = *pcVar2;
              pcVar2 = pcVar6;
            } while (cVar1 == '/');
          } while (cVar1 == '\\');
          if (cVar1 == '\0') break;
          bVar3 = false;
          pcVar6 = pArchive_name;
        }
        if (*pArchive_name == '\0') {
          if (*__file == '/') {
            if (bVar3) {
LAB_003a38ac:
              pArchive_name = pArchive_name + -1;
            }
          }
          else if (*__file == '\\' && bVar3) goto LAB_003a38ac;
        }
        ext_attributes = ext_attributes | file_stat.st_mode << 0x10 | file_stat.st_mode >> 7 & 1 ^ 1
        ;
        mVar4 = mz_zip_writer_add_file(&zip_archive,pArchive_name,__file,"",0,6,ext_attributes);
        sVar8 = sVar8 + 1;
      } while (mVar4 != 0);
      mz_zip_writer_finalize_archive(&zip_archive);
      mz_zip_writer_end(&zip_archive);
    }
  }
  return iVar7;
}

Assistant:

int zip_create(const char *zipname, const char *filenames[], size_t len) {
  int status = 0;
  size_t i;
  mz_zip_archive zip_archive;
  struct MZ_FILE_STAT_STRUCT file_stat;
  mz_uint32 ext_attributes = 0;

  if (!zipname || strlen(zipname) < 1) {
    // zip_t archive name is empty or NULL
    return -1;
  }

  // Create a new archive.
  if (!memset(&(zip_archive), 0, sizeof(zip_archive))) {
    // Cannot memset zip archive
    return -1;
  }

  if (!mz_zip_writer_init_file(&zip_archive, zipname, 0)) {
    // Cannot initialize zip_archive writer
    return -1;
  }

  memset((void *)&file_stat, 0, sizeof(struct MZ_FILE_STAT_STRUCT));

  for (i = 0; i < len; ++i) {
    const char *name = filenames[i];
    if (!name) {
      status = -1;
      break;
    }

    if (MZ_FILE_STAT(name, &file_stat) != 0) {
      // problem getting information - check errno
      return -1;
    }

    if ((file_stat.st_mode & 0200) == 0) {
      // MS-DOS read-only attribute
      ext_attributes |= 0x01;
    }
    ext_attributes |= (mz_uint32)((file_stat.st_mode & 0xFFFF) << 16);

    if (!mz_zip_writer_add_file(&zip_archive, base_name(name), name, "", 0,
                                ZIP_DEFAULT_COMPRESSION_LEVEL,
                                ext_attributes)) {
      // Cannot add file to zip_archive
      status = -1;
      break;
    }
  }

  mz_zip_writer_finalize_archive(&zip_archive);
  mz_zip_writer_end(&zip_archive);
  return status;
}